

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
          (IncompleteCubeMissingLevelCase *this,TestContext *testCtx,RenderContext *renderCtx,
          char *name,char *description,IVec2 *size,int invalidLevelNdx,CubeFace invalidCubeFace)

{
  int i;
  long lVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,description);
  (this->super_TexCubeCompletenessCase).m_testCtx = testCtx;
  (this->super_TexCubeCompletenessCase).m_renderCtx = renderCtx;
  (this->super_TexCubeCompletenessCase).m_compareColor.m_value = 0xff000000;
  (this->super_TexCubeCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02171c70;
  *(int *)&(this->super_TexCubeCompletenessCase).field_0x84 = invalidLevelNdx;
  this->m_invalidCubeFace = invalidCubeFace;
  lVar1 = 0;
  do {
    (this->m_size).m_data[lVar1] = size->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, int invalidLevelNdx, tcu::CubeFace invalidCubeFace)
	: TexCubeCompletenessCase		(testCtx, renderCtx, name, description)
	, m_invalidLevelNdx				(invalidLevelNdx)
	, m_invalidCubeFace				(invalidCubeFace)
	, m_size						(size)
{
}